

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrScenePlaneAlignmentFilterInfoMSFT *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  ulong uVar5;
  string alignments_prefix;
  string type_prefix;
  string alignments_array_prefix;
  string alignmentcount_prefix;
  string next_prefix;
  string local_368;
  string local_348;
  ostringstream oss_alignmentCount;
  ostringstream oss_alignments_array;
  uint auStack_190 [88];
  
  PointerToHexString<XrScenePlaneAlignmentFilterInfoMSFT>
            ((XrScenePlaneAlignmentFilterInfoMSFT *)alignments_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_alignmentCount);
  std::__cxx11::string::~string((string *)&oss_alignmentCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_alignmentCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_alignmentCount);
    std::__cxx11::string::~string((string *)&oss_alignmentCount);
  }
  else {
    _oss_alignmentCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_alignmentCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_alignmentCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_368,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_368,contents);
  std::__cxx11::string::~string((string *)&local_368);
  if (bVar2) {
    std::__cxx11::string::string((string *)&alignmentcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&alignmentcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_alignmentCount);
    poVar4 = std::operator<<((ostream *)&oss_alignmentCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&alignmentcount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_alignments_array);
    std::__cxx11::string::~string((string *)&oss_alignments_array);
    std::__cxx11::string::string((string *)&alignments_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&alignments_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_alignments_array);
    *(uint *)((long)auStack_190 + *(long *)(_oss_alignments_array + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_oss_alignments_array + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_alignments_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [37])"const XrScenePlaneAlignmentTypeMSFT*",&alignments_prefix,
               &alignments_array_prefix);
    std::__cxx11::string::~string((string *)&alignments_array_prefix);
    for (uVar5 = 0; uVar5 < value->alignmentCount; uVar5 = uVar5 + 1) {
      std::__cxx11::string::string((string *)&alignments_array_prefix,(string *)&alignments_prefix);
      std::__cxx11::string::append((char *)&alignments_array_prefix);
      std::__cxx11::to_string(&local_348,(uint)uVar5);
      std::__cxx11::string::append((string *)&alignments_array_prefix);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::append((char *)&alignments_array_prefix);
      std::__cxx11::to_string(&local_348,value->alignments[uVar5]);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[37],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [37])"const XrScenePlaneAlignmentTypeMSFT*",
                 &alignments_array_prefix,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&alignments_array_prefix);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_alignments_array);
    std::__cxx11::string::~string((string *)&alignments_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_alignmentCount);
    std::__cxx11::string::~string((string *)&alignmentcount_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrScenePlaneAlignmentFilterInfoMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string alignmentcount_prefix = prefix;
        alignmentcount_prefix += "alignmentCount";
        std::ostringstream oss_alignmentCount;
        oss_alignmentCount << "0x" << std::hex << (value->alignmentCount);
        contents.emplace_back("uint32_t", alignmentcount_prefix, oss_alignmentCount.str());
        std::string alignments_prefix = prefix;
        alignments_prefix += "alignments";
        std::ostringstream oss_alignments_array;
        oss_alignments_array << std::hex << reinterpret_cast<const void*>(value->alignments);
        contents.emplace_back("const XrScenePlaneAlignmentTypeMSFT*", alignments_prefix, oss_alignments_array.str());
        for (uint32_t value_alignments_inc = 0; value_alignments_inc < value->alignmentCount; ++value_alignments_inc) {
            std::string alignments_array_prefix = alignments_prefix;
            alignments_array_prefix += "[";
            alignments_array_prefix += std::to_string(value_alignments_inc);
            alignments_array_prefix += "]";
            contents.emplace_back("const XrScenePlaneAlignmentTypeMSFT*", alignments_array_prefix, std::to_string(value->alignments[value_alignments_inc]));
        }
        return true;
    } catch(...) {
    }
    return false;
}